

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::UnpackUnorm2x16Case::iterate(UnpackUnorm2x16Case *this)

{
  uint uVar1;
  ShaderExecutor *pSVar2;
  uint uVar3;
  UnpackUnorm2x16Case *pUVar4;
  deUint32 dVar5;
  ostream *poVar6;
  char *description;
  int iVar7;
  long lVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  void *out;
  deUint32 u32_1;
  deUint32 u32_3;
  deUint32 u32;
  deUint32 u32_2;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  Random rnd;
  void *in;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_238;
  Hex<8UL> local_218;
  UnpackUnorm2x16Case *local_210;
  int local_204;
  float local_200;
  float local_1fc;
  float local_1f8;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_1e8;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [376];
  
  dVar5 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar5 ^ 0x776002);
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_1e8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b0._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_238,(iterator)0x0,(uint *)local_1b0);
  local_1b0._0_4_ = 0x7fff8000;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x7fff8000;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x80007fff;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x80007fff;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0xffffffff;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xffffffff;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1b0._0_4_ = 0x1fffe;
  if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_238,
               (iterator)
               local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)local_1b0);
  }
  else {
    *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 0x1fffe;
    local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar7 = 0x5f;
  do {
    dVar5 = deRandom_getUint32(&local_1c0);
    local_1b0._0_4_ = dVar5;
    if (local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_238,
                 (iterator)
                 local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1b0);
    }
    else {
      *local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = dVar5;
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar7 = iVar7 + -1;
  } while (iVar7 != 0);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_1e8,
             (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  local_1b0 = (undefined1  [8])
              ((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
              m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  local_1b0 = (undefined1  [8])
              local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_218.value =
       (deUint64)
       local_1e8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (*((this->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar2 = (this->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar2->_vptr_ShaderExecutor[6])
            (pSVar2,(ulong)((long)local_238.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_238.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 2,local_1b0,&local_218
            );
  local_1c8 = (ulong)((long)local_238.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2;
  local_210 = this;
  if ((int)local_1c8 < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    iVar7 = 0;
    do {
      uVar1 = *(uint *)((long)(qpTestLog **)
                              local_238.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar8 * 4);
      fVar11 = (float)(uVar1 >> 0x10) / 65535.0;
      local_1f8 = local_1e8.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar8].m_data[0];
      local_200 = local_1e8.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar8].m_data[1];
      fVar10 = (float)(uVar1 & 0xffff) / 65535.0;
      uVar1 = (int)local_200 - (int)fVar11;
      if ((uint)local_200 < (uint)fVar11) {
        uVar1 = -((int)local_200 - (int)fVar11);
      }
      uVar3 = (int)local_1f8 - (int)fVar10;
      if ((uint)local_1f8 < (uint)fVar10) {
        uVar3 = -((int)local_1f8 - (int)fVar10);
      }
      local_1fc = local_200;
      local_1f4 = local_1f8;
      local_1f0 = fVar11;
      local_1ec = fVar10;
      if (1 < (uVar1 | uVar3)) {
        if (iVar7 < 10) {
          local_1b0 = (undefined1  [8])
                      ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          local_204 = iVar7;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<((ostringstream *)local_1a8,(int)lVar8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,",\n",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  expected unpackUnorm2x16(",0x1b);
          local_218.value =
               (deUint64)
               *(uint *)((long)(qpTestLog **)
                               local_238.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar8 * 4);
          tcu::Format::Hex<8UL>::toStream(&local_218,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") = ",4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"vec2(",5);
          poVar6 = std::ostream::_M_insert<double>((double)local_1ec);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_218.value = (deUint64)(uint)fVar10;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_1f0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_218.value = (deUint64)(uint)fVar11;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", got vec2(",0xb)
          ;
          poVar6 = std::ostream::_M_insert<double>((double)local_1f4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_218.value = (deUint64)(uint)local_1f8;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          poVar6 = std::ostream::_M_insert<double>((double)local_1fc);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," / ",3);
          local_218.value = (deUint64)(uint)local_200;
          tcu::Format::Hex<8UL>::toStream(&local_218,poVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\n  ULP diffs = (",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"), max diff = ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          iVar7 = local_204;
        }
        else if (iVar7 == 10) {
          local_1b0 = (undefined1  [8])
                      ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        }
        iVar7 = iVar7 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)((ulong)((long)local_238.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_238.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 2));
  }
  pUVar4 = local_210;
  local_1b0 = (undefined1  [8])
              ((local_210->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar9 = (int)local_1c8;
  std::ostream::operator<<((ostringstream *)local_1a8,iVar9 - iVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," / ",3);
  std::ostream::operator<<((ostringstream *)local_1a8,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  description = "Pass";
  if (iVar7 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((pUVar4->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,(uint)(iVar7 != 0),description);
  if (local_1e8.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((TestLog *)
      local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (TestLog *)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	in0			= (deUint16)(inputs[valNdx] & 0xffff);
				const deUint16	in1			= (deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= float(in0) / 65535.0f;
				const float		ref1		= float(in1) / 65535.0f;
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	diff0		= getUlpDiff(ref0, res0);
				const deUint32	diff1		= getUlpDiff(ref1, res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackUnorm2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ")"
															   << ", got vec2(" << HexFloat(res0) << ", " << HexFloat(res1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}